

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol-reader2.h
# Opt level: O2

pair<NLW2_SOLReadResultCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* mp::ReadSOLFile<mp::SOLHandler_Easy>
            (pair<NLW2_SOLReadResultCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *name,SOLHandler_Easy *solh,NLUtils *utl,
            int *p_internal_rv)

{
  NLW2_SOLReadResultCode NVar1;
  SOLReader2<mp::SOLHandler_Easy> solr;
  undefined1 local_498 [320];
  _Alloc_hider local_358;
  size_type local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  undefined8 local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  Long local_f8 [2];
  int local_6c;
  
  local_498._0_8_ = solh;
  local_498._8_8_ = utl;
  memcpy(local_498 + 0x10,solh,0x110);
  local_498._288_8_ = local_498 + 0x130;
  local_498._296_8_ = 0;
  local_498[0x130] = '\0';
  local_358._M_p = (pointer)&local_348;
  local_350 = 0;
  local_348._M_local_buf[0] = '\0';
  local_338._0_4_ = 0;
  local_338._4_4_ = NLW2_SOLRead_Result_Not_Set;
  local_330 = (char *)0x0;
  local_328 = "ASCII";
  local_320 = "binary";
  local_f8[0] = -2;
  local_f8[1] = -2;
  local_6c = -2;
  NVar1 = SOLReader2<mp::SOLHandler_Easy>::ReadSOLFile
                    ((SOLReader2<mp::SOLHandler_Easy> *)local_498,name);
  if (p_internal_rv != (int *)0x0) {
    *p_internal_rv = (int)local_338;
  }
  __return_storage_ptr__->first = NVar1;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->second,(string *)&local_358);
  SOLReader2<mp::SOLHandler_Easy>::~SOLReader2((SOLReader2<mp::SOLHandler_Easy> *)local_498);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<NLW2_SOLReadResultCode, std::string>
ReadSOLFile(
    const std::string& name,
		SOLHandler& solh, NLUtils& utl, int* p_internal_rv=nullptr) {
  SOLReader2<SOLHandler> solr(solh, utl);
	auto res = solr.ReadSOLFile(name);
	if (p_internal_rv)
		*p_internal_rv = solr.internal_rv();
	return { res, solr.ErrorMessage(res) };
}